

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_raw_buffer(uchar **p,uchar *start,uchar *buf,size_t size)

{
  uchar *puVar1;
  
  puVar1 = *p;
  if ((ulong)((long)puVar1 - (long)start) < size || puVar1 < start) {
    size = 0xffffffffffffff94;
  }
  else {
    *p = puVar1 + -size;
    memcpy(puVar1 + -size,buf,size);
  }
  return (int)size;
}

Assistant:

int mbedtls_asn1_write_raw_buffer(unsigned char **p, const unsigned char *start,
                                  const unsigned char *buf, size_t size)
{
    size_t len = 0;

    if (*p < start || (size_t) (*p - start) < size) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = size;
    (*p) -= len;
    memcpy(*p, buf, len);

    return (int) len;
}